

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMatrixAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>_>::writeValueTo
          (TypedAttribute<Imath_3_2::Matrix44<double>_> *this,OStream *os,int version)

{
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[0][0]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[0][1]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[0][2]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[0][3]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[1][0]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[1][1]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[1][2]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[1][3]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[2][0]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[2][1]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[2][2]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[2][3]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[3][0]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[3][1]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[3][2]);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x[3][3]);
  return;
}

Assistant:

IMF_EXPORT void
M44dAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value[0][0]);
    Xdr::write<StreamIO> (os, _value[0][1]);
    Xdr::write<StreamIO> (os, _value[0][2]);
    Xdr::write<StreamIO> (os, _value[0][3]);

    Xdr::write<StreamIO> (os, _value[1][0]);
    Xdr::write<StreamIO> (os, _value[1][1]);
    Xdr::write<StreamIO> (os, _value[1][2]);
    Xdr::write<StreamIO> (os, _value[1][3]);

    Xdr::write<StreamIO> (os, _value[2][0]);
    Xdr::write<StreamIO> (os, _value[2][1]);
    Xdr::write<StreamIO> (os, _value[2][2]);
    Xdr::write<StreamIO> (os, _value[2][3]);

    Xdr::write<StreamIO> (os, _value[3][0]);
    Xdr::write<StreamIO> (os, _value[3][1]);
    Xdr::write<StreamIO> (os, _value[3][2]);
    Xdr::write<StreamIO> (os, _value[3][3]);
}